

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O1

double compute_error(vec *last_layer,int nx)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  
  dVar6 = 0.0;
  if (1 < nx) {
    uVar4 = 0;
    uVar5 = 0;
    uVar3 = 0;
    do {
      dVar6 = (last_layer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      uVar3 = uVar3 + 1;
      dVar1 = (double)(int)uVar3 * (0.7853981633974483 / (double)nx);
      dVar2 = sin(dVar1 * 3.0);
      dVar1 = cos(dVar1 + dVar1);
      dVar6 = ABS(dVar6 - (dVar2 * 0.6766764161830635 + dVar1 * -0.004957504353332717));
      if (dVar6 <= (double)CONCAT44(uVar5,uVar4)) {
        dVar6 = (double)CONCAT44(uVar5,uVar4);
      }
      uVar4 = SUB84(dVar6,0);
      uVar5 = (undefined4)((ulong)dVar6 >> 0x20);
    } while (nx - 1 != uVar3);
  }
  return dVar6;
}

Assistant:

double compute_error(const vec& last_layer, int nx)
{
    double max_error = 0.0;
    double h = X / nx;

    for (int i = 0; i < nx - 1; i++)
    {
        double current_error =
            std::abs(last_layer[i] - exact_solution(h * (i + 1), T));
        if (current_error > max_error)
        {
            max_error = current_error;
        }
    }

    return max_error;
}